

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfB44Compressor.cpp
# Opt level: O0

void __thiscall Imf_2_5::B44Compressor::~B44Compressor(B44Compressor *this)

{
  void *in_RDI;
  B44Compressor *unaff_retaddr;
  
  ~B44Compressor(unaff_retaddr);
  operator_delete(in_RDI,0x58);
  return;
}

Assistant:

B44Compressor::~B44Compressor ()
{
    delete [] _tmpBuffer;
    delete [] _outBuffer;
    delete [] _channelData;
}